

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ContextScopeBase::ContextScopeBase(ContextScopeBase *this)

{
  IContextScope *in_RDI;
  vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_>
  *in_stack_ffffffffffffffe0;
  
  IContextScope::IContextScope(in_RDI);
  in_RDI->_vptr_IContextScope = (_func_int **)&PTR__ContextScopeBase_00147ad8;
  *(undefined1 *)&in_RDI[1]._vptr_IContextScope = 1;
  g_infoContexts();
  std::vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_>::push_back
            (in_stack_ffffffffffffffe0,(value_type *)in_RDI);
  return;
}

Assistant:

ContextScopeBase::ContextScopeBase() {
        g_infoContexts.push_back(this);
    }